

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O0

void __thiscall
CorUnix::CThreadSuspensionInfo::ReleaseSuspensionLock
          (CThreadSuspensionInfo *this,CPalThread *pthrCurrent)

{
  uint uVar1;
  int iPthreadError;
  CPalThread *pthrCurrent_local;
  CThreadSuspensionInfo *this_local;
  
  uVar1 = pthread_mutex_unlock((pthread_mutex_t *)&(pthrCurrent->suspensionInfo).m_ptmSuspmutex);
  if (uVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","ReleaseSuspensionLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
            ,0x1ab);
    fprintf(_stderr,
            "Expression: iPthreadError == 0, Description: pthread_mutex_unlock returned %d\n",
            (ulong)uVar1);
  }
  return;
}

Assistant:

void
CThreadSuspensionInfo::ReleaseSuspensionLock(
    CPalThread* pthrCurrent
    )
{
#ifdef USE_GLOBAL_LOCK_FOR_SUSPENSION
{
    g_ssSuspensionLock.Leave();
}
#else // USE_GLOBAL_LOCK_FOR_SUSPENSION
{
    #if DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
    {
        pthrCurrent->suspensionInfo.m_nSpinlock.Leave();
    }
    #else // DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
    {
        INDEBUG(int iPthreadError = )
        pthread_mutex_unlock(&pthrCurrent->suspensionInfo.m_ptmSuspmutex);
        _ASSERT_MSG(iPthreadError == 0, "pthread_mutex_unlock returned %d\n", iPthreadError);
    }
    #endif // DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
}
#endif // USE_GLOBAL_LOCK_FOR_SUSPENSION
}